

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_simple::test_method(addrman_simple *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  __single_object _Var2;
  undefined **__p;
  bool bVar3;
  readonly_property<bool> rVar4;
  int32_t iVar5;
  uint uVar6;
  size_t sVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  CAddress *pCVar9;
  iterator pvVar10;
  CService *pCVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_00;
  const_string file_05;
  const_string file_06;
  initializer_list<CAddress> __l_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  undefined4 uVar12;
  undefined4 uVar13;
  char *pcVar14;
  assertion_result *ar;
  char *pcVar15;
  undefined8 in_stack_fffffffffffffb70;
  NodeContext *node_ctx;
  undefined8 in_stack_fffffffffffffb78;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  allocator_type local_3d1;
  vector<CAddress,_std::allocator<CAddress>_> local_3d0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  __single_object addrman;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  CService local_208;
  CService addr2;
  CService local_1b8;
  CService addr1_dup;
  CAddress addr_ret1;
  CService local_128;
  CService addr1;
  undefined **local_d8 [2];
  undefined1 *local_c8;
  assertion_result *local_c0;
  uint16_t local_b8;
  duration local_b0;
  ServiceFlags SStack_a8;
  CAddress addr_null;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node_ctx = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node;
  iVar5 = GetCheckRatio(node_ctx);
  local_d8[0] = (undefined **)CONCAT44(local_d8[0]._4_4_,iVar5);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"252.2.2.2",(allocator<char> *)&addr_null);
  ResolveIP(&source,(string *)local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x48;
  file.m_begin = (iterator)&local_240;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_250,msg);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc7f1cc;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_258 = "";
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar9 = &addr_null;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)(uint)addr_ret1.super_CService.super_CNetAddr.m_addr._union._4_4_ << 0x20);
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_d8,&local_260,0x48);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,(optional<Network>)0x0)
  ;
  addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  addr_null.super_CService.super_CNetAddr.m_addr._size = local_c8._0_4_;
  local_c8 = (undefined1 *)((ulong)local_c8 & 0xffffffff00000000);
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_null.super_CService.super_CNetAddr._24_8_ = local_c0;
  addr_null.super_CService.port = local_b8;
  addr_null.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_null.nServices = SStack_a8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4a;
  file_00.m_begin = (iterator)&local_270;
  msg_00.m_end = (iterator)pCVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_280,
             msg_00);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc7f1cc;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_288 = "";
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr_ret1,&addr_null.super_CService);
  pcVar15 = "\"[::]:0\"";
  pcVar14 = "[::]:0";
  uVar12 = 0xb64ce2;
  uVar13 = 0;
  pvVar8 = (iterator)0x2;
  pCVar9 = &addr_ret1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_d8,&local_290,0x4a,1);
  std::__cxx11::string::~string((string *)&addr_ret1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"250.1.1.1",(allocator<char> *)&addr_ret1);
  ResolveService(&addr1,(string *)local_d8,0x208d);
  std::__cxx11::string::~string((string *)local_d8);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4e;
  file_01.m_begin = (iterator)&local_2a0;
  msg_01.m_end = (iterator)pCVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b0,
             msg_01);
  _Var2 = addrman;
  CService::CService(&local_128,&addr1);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar13;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar12;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = pcVar14;
  ipIn.super_CNetAddr.m_addr._16_8_ = pcVar15;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb70;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffb78;
  CAddress::CAddress((CAddress *)local_d8,ipIn,(ServiceFlags)&local_128);
  __l._M_len = 1;
  __l._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2,__l,(allocator_type *)&vAddr);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr2,&source,(seconds)0x0);
  addr1_dup.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_228;
  local_228._0_8_ = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_228._8_8_ = "";
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2b8 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1_dup,(lazy_ostream *)&addr_ret1,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_2c0,0x4e);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1_dup.super_CNetAddr.m_addr._size)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4f;
  file_02.m_begin = (iterator)&local_2d0;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2e0,
             msg_02);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc7f1cc;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2e8 = "";
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar9 = &addr_ret1;
  addr1_dup.super_CNetAddr.m_addr._union._0_4_ = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_d8,&local_2f0,0x4f);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,(optional<Network>)0x0)
  ;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  uVar12 = local_c8._0_4_;
  local_c8 = (undefined1 *)((ulong)local_c8 & 0xffffffff00000000);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_ret1.super_CService.super_CNetAddr.m_addr._size = uVar12;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_c0;
  addr_ret1.super_CService.port = local_b8;
  addr_ret1.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_ret1.nServices = SStack_a8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_300;
  msg_03.m_end = (iterator)pCVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_310,
             msg_03);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc7f1cc;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_318 = "";
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr1_dup,&addr_ret1.super_CService);
  pcVar15 = "\"250.1.1.1:8333\"";
  pcVar14 = "250.1.1.1:8333";
  uVar12 = 0xb64d43;
  uVar13 = 0;
  pvVar8 = (iterator)0x2;
  pCVar11 = &addr1_dup;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (local_d8,&local_320,0x51,1);
  std::__cxx11::string::~string((string *)&addr1_dup);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"250.1.1.1",(allocator<char> *)&addr2);
  ResolveService(&addr1_dup,(string *)local_d8,0x208d);
  std::__cxx11::string::~string((string *)local_d8);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x56;
  file_04.m_begin = (iterator)&local_330;
  msg_04.m_end = (iterator)pCVar11;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_340,
             msg_04);
  _Var2 = addrman;
  CService::CService(&local_1b8,&addr1_dup);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar13;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar12;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = pcVar14;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = pcVar15;
  ipIn_00.super_CNetAddr._24_8_ = node_ctx;
  ipIn_00._32_8_ = in_stack_fffffffffffffb78;
  CAddress::CAddress((CAddress *)local_d8,ipIn_00,(ServiceFlags)&local_1b8);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&vAddr,__l_00,(allocator_type *)&local_3e8);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,
                       (seconds)0x0);
  ar = (assertion_result *)local_228;
  local_228[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_228._8_8_ = (element_type *)0x0;
  aStack_218._M_allocated_capacity = 0;
  addr2.super_CNetAddr._24_8_ = &local_3d0;
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb64d80;
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb64db7;
  addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_360 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)&addr2,1,0,WARN,(check_type)pcVar14,(size_t)&local_368,0x56);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_218._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1b8);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x57;
  file_05.m_begin = (iterator)&local_378;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
             msg_05);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc7f1cc;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_390 = "";
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar11 = &addr2;
  local_228._0_4_ = 1;
  pcVar14 = "1U";
  uVar12 = 0xb64cd2;
  uVar13 = 0;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_d8,&local_398,0x57,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"250.1.1.2",(allocator<char> *)local_228);
  ResolveService(&addr2,(string *)local_d8,0x208d);
  std::__cxx11::string::~string((string *)local_d8);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x61;
  file_06.m_begin = (iterator)&local_3a8;
  msg_06.m_end = (iterator)pCVar11;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3b8,
             msg_06);
  _Var2 = addrman;
  CService::CService(&local_208,&addr2);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar13;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar12;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = ar;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar14;
  ipIn_01.super_CNetAddr._24_8_ = node_ctx;
  ipIn_01._32_8_ = in_stack_fffffffffffffb78;
  CAddress::CAddress((CAddress *)local_d8,ipIn_01,(ServiceFlags)&local_208);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_3d0,__l_01,&local_3d1);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_3d0,&source,
                       (seconds)0x0);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,bVar3);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3e8 = "addrman->Add({CAddress(addr2, NODE_NONE)}, source)";
  local_3e0 = "";
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_218._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3f0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  aStack_218._8_8_ = (allocator_type *)&local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)local_228,1,0,WARN,(check_type)ar,
             (size_t)&local_3f8,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_3d0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_208);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x62;
  file_07.m_begin = (iterator)&local_408;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_418,
             msg_07);
  sVar7 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_228[0] = (class_property<bool>)(class_property<bool>)(sVar7 != 0);
  local_228._8_8_ = (element_type *)0x0;
  aStack_218._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_124d8c;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb64e09;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_420 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_c0 = (assertion_result *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_d8,1,0,WARN,(check_type)ar,
             (size_t)&local_428,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_218._M_allocated_capacity);
  uVar6 = GetCheckRatio(node_ctx);
  local_228._0_4_ = uVar6;
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)local_d8,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  __p = local_d8[0];
  local_d8[0] = (undefined **)0x0;
  std::__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>::reset
            ((__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> *)&addrman,(pointer)__p);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)local_d8);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,"250.1.1.3",(allocator<char> *)&local_3e8);
  ResolveService((CService *)local_d8,(string *)local_228,0x208d);
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3d0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,"250.1.1.4",(allocator<char> *)&local_3e8);
  ResolveService((CService *)local_d8,(string *)local_228,0x208d);
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3d0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  std::__cxx11::string::~string((string *)local_228);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x69;
  file_08.m_begin = (iterator)&local_438;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_448,
             msg_08);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       AddrMan::Add((AddrMan *)
                    addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,(seconds)0x0
                   );
  local_228._8_8_ = (element_type *)0x0;
  aStack_218._M_allocated_capacity = 0;
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb64e1e;
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb64e39;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_450 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_c0 = (assertion_result *)&local_3d0;
  local_228[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_d8,1,0,WARN,(check_type)ar,
             (size_t)&local_458,0x69);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_218._M_allocated_capacity);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x6a;
  file_09.m_begin = (iterator)&local_468;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_478,
             msg_09);
  sVar7 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_228[0] = (class_property<bool>)(class_property<bool>)(sVar7 != 0);
  local_228._8_8_ = (element_type *)0x0;
  aStack_218._M_allocated_capacity = 0;
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb64df5;
  local_3d0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb64e09;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_d8,1,0,WARN,(check_type)ar,
             (size_t)&stack0xfffffffffffffb78,0x6a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_218._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1_dup);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_ret1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_null);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_simple)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    // Test: Does Addrman respond correctly when empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    auto addr_null = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_null.ToStringAddrPort(), "[::]:0");

    // Test: Does Addrman::Add work as expected.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    auto addr_ret1 = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_ret1.ToStringAddrPort(), "250.1.1.1:8333");

    // Test: Does IP address deduplication work correctly.
    //  Expected dup IP should not be added.
    CService addr1_dup = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(!addrman->Add({CAddress(addr1_dup, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);


    // Test: New table has one addr and we add a diff addr we should
    //  have at least one addr.
    // Note that addrman's size cannot be tested reliably after insertion, as
    // hash collisions may occur. But we can always be sure of at least one
    // success.

    CService addr2 = ResolveService("250.1.1.2", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Size() >= 1);

    // Test: reset addrman and test AddrMan::Add multiple addresses works as expected
    addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    std::vector<CAddress> vAddr;
    vAddr.emplace_back(ResolveService("250.1.1.3", 8333), NODE_NONE);
    vAddr.emplace_back(ResolveService("250.1.1.4", 8333), NODE_NONE);
    BOOST_CHECK(addrman->Add(vAddr, source));
    BOOST_CHECK(addrman->Size() >= 1);
}